

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O0

int read_line(lua_State *L,FILE *f,int chop)

{
  char *__s;
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  char *p;
  size_t l;
  luaL_Buffer b;
  int chop_local;
  FILE *f_local;
  lua_State *L_local;
  
  b.initb._8188_4_ = chop;
  luaL_buffinit(L,(luaL_Buffer *)&l);
  while( true ) {
    __s = luaL_prepbuffsize((luaL_Buffer *)&l,0x2000);
    pcVar1 = fgets(__s,0x2000,(FILE *)f);
    if (pcVar1 == (char *)0x0) {
      luaL_pushresult((luaL_Buffer *)&l);
      sVar2 = lua_rawlen(L,-1);
      return (uint)(sVar2 != 0);
    }
    sVar3 = strlen(__s);
    if ((sVar3 != 0) && (__s[sVar3 - 1] == '\n')) break;
    b.size = sVar3 + b.size;
  }
  b.size = (sVar3 - (long)(int)b.initb._8188_4_) + b.size;
  luaL_pushresult((luaL_Buffer *)&l);
  return 1;
}

Assistant:

static int read_line (lua_State *L, FILE *f, int chop) {
  luaL_Buffer b;
  luaL_buffinit(L, &b);
  for (;;) {
    size_t l;
    char *p = luaL_prepbuffer(&b);
    if (fgets(p, LUAL_BUFFERSIZE, f) == NULL) {  /* eof? */
      luaL_pushresult(&b);  /* close buffer */
      return (lua_rawlen(L, -1) > 0);  /* check whether read something */
    }
    l = strlen(p);
    if (l == 0 || p[l-1] != '\n')
      luaL_addsize(&b, l);
    else {
      luaL_addsize(&b, l - chop);  /* chop 'eol' if needed */
      luaL_pushresult(&b);  /* close buffer */
      return 1;  /* read at least an `eol' */
    }
  }
}